

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsTorqueConverter::ChShaftsTorqueConverter(ChShaftsTorqueConverter *this)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  undefined8 local_18;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsTorqueConverter_01170738;
  this->shaft1 = (ChShaft *)0x0;
  this->shaft2 = (ChShaft *)0x0;
  this->shaft_stator = (ChShaft *)0x0;
  this->torque_in = 0.0;
  this->torque_out = 0.0;
  (this->K).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->K).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->T).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)((long)&this->shaft2 + 2) = 0;
  *(undefined8 *)((long)&this->shaft_stator + 2) = 0;
  *(undefined8 *)((long)&this->torque_in + 2) = 0;
  *(undefined8 *)((long)&this->torque_out + 2) = 0;
  *(undefined8 *)
   ((long)&(this->K).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 2)
       = 0;
  *(undefined8 *)
   ((long)&(this->K).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 2) = 0;
  *(undefined8 *)
   ((long)&(this->T).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 2)
       = 0;
  *(undefined8 *)
   ((long)&(this->T).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 2) = 0;
  local_18 = 0x3feccccccccccccd;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&_Stack_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->K,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  local_18 = 0x3feccccccccccccd;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&_Stack_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->T,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

ChShaftsTorqueConverter::ChShaftsTorqueConverter()
    : shaft1(NULL),
      shaft2(NULL),
      shaft_stator(NULL),
      torque_in(0),
      torque_out(0),
      state_warning_reverseflow(false),
      state_warning_wrongimpellerdirection(false) {
    K = chrono_types::make_shared<ChFunction_Const>(0.9);
    T = chrono_types::make_shared<ChFunction_Const>(0.9);
}